

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  Mem *pMem;
  JsonParse *pParse;
  char *zPath;
  JsonNode *pJVar1;
  uint uVar2;
  i64 val;
  int iVar3;
  
  pParse = jsonParseCached(ctx,argv,ctx);
  if (pParse != (JsonParse *)0x0) {
    if (argc == 2) {
      zPath = (char *)sqlite3ValueText(argv[1],'\x01');
      pJVar1 = jsonLookup(pParse,zPath,(int *)0x0,ctx);
    }
    else {
      pJVar1 = pParse->aNode;
    }
    if (pJVar1 != (JsonNode *)0x0) {
      if ((pJVar1->eType == '\x06') && (pJVar1->n != 0)) {
        uVar2 = 1;
        val = 0;
        do {
          iVar3 = 1;
          if (5 < pJVar1[uVar2].eType) {
            iVar3 = pJVar1[uVar2].n + 1;
          }
          uVar2 = uVar2 + iVar3;
          val = val + 1;
        } while (uVar2 <= pJVar1->n);
      }
      else {
        val = 0;
      }
      pMem = ctx->pOut;
      if ((pMem->flags & 0x9000) != 0) {
        vdbeReleaseAndSetInt64(pMem,val);
        return;
      }
      (pMem->u).i = val;
      pMem->flags = 4;
    }
  }
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 n = 0;
  u32 i;
  JsonNode *pNode;

  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  assert( p->nNode );
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    pNode = jsonLookup(p, zPath, 0, ctx);
  }else{
    pNode = p->aNode;
  }
  if( pNode==0 ){
    return;
  }
  if( pNode->eType==JSON_ARRAY ){
    assert( (pNode->jnFlags & JNODE_APPEND)==0 );
    for(i=1; i<=pNode->n; n++){
      i += jsonNodeSize(&pNode[i]);
    }
  }
  sqlite3_result_int64(ctx, n);
}